

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsequentialanimationgroup.cpp
# Opt level: O0

int __thiscall
QSequentialAnimationGroup::qt_metacall(QSequentialAnimationGroup *this,Call _c,int _id,void **_a)

{
  QAnimationGroup *in_RCX;
  int in_ESI;
  undefined8 in_RDI;
  void **unaff_retaddr;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QAnimationGroup::qt_metacall
                       (in_RCX,(Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)0x68b7e5);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 2) {
        qt_static_metacall((QObject *)CONCAT44(_c,_id),_a._4_4_,(int)_a,unaff_retaddr);
      }
      local_18 = local_18 + -2;
    }
    if (in_ESI == 7) {
      if (local_18 < 2) {
        qt_static_metacall((QObject *)CONCAT44(_c,_id),_a._4_4_,(int)_a,unaff_retaddr);
      }
      local_18 = local_18 + -2;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall((QObject *)CONCAT44(_c,_id),_a._4_4_,(int)_a,unaff_retaddr);
      local_18 = local_18 + -1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QSequentialAnimationGroup::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAnimationGroup::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}